

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O2

DFA * __thiscall
RegexToDFAConverter::convert(DFA *__return_storage_ptr__,RegexToDFAConverter *this,string *expr)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *this_00;
  char cVar1;
  int iVar2;
  pointer pcVar3;
  SyntaxTreeNode *this_01;
  mapped_type *pmVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int *piVar5;
  _Base_ptr p_Var6;
  __node_base *p_Var7;
  long lVar8;
  long lVar9;
  int local_104;
  int it;
  undefined4 uStack_f4;
  int *piStack_f0;
  pointer local_e8;
  int local_e0;
  int it_1;
  int curr_pos;
  vector<int,_std::allocator<int>_> next;
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  que;
  string simplified_expr;
  
  simplify(&simplified_expr,this,expr);
  curr_pos = 0;
  this->leaves_count_ = 0;
  std::
  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
  ::clear(&this->follow_pos_);
  pcVar3 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar3) {
    (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar3;
  }
  this_01 = expression_eval(this,&simplified_expr,&curr_pos);
  std::
  queue<std::vector<int,std::allocator<int>>,std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
  ::
  queue<std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,void>
            (&que);
  _it = (int *)0x0;
  piStack_f0 = (int *)0x0;
  local_e8 = (pointer)0x0;
  std::
  deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>::
  emplace_back<std::vector<int,std::allocator<int>>>
            ((deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)&que,(vector<int,_std::allocator<int>_> *)&it);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&it);
  p_Var7 = &(this_01->first_pos)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _it = (int *)CONCAT44(uStack_f4,(int)*(size_type *)(p_Var7 + 1));
    std::vector<int,_std::allocator<int>_>::push_back
              (que.c.
               super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,(value_type_conflict1 *)&it);
  }
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             ((que.c.
               super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              ((que.c.
                super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish,(anon_class_8_1_8991fb9c)this);
  this_00 = &this->mark_;
  std::
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&this_00->_M_t);
  DFA::DFA(__return_storage_ptr__);
  pmVar4 = std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::operator[](this_00,que.c.
                                super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur);
  *pmVar4 = 1;
  DFA::add_node(__return_storage_ptr__,1);
  local_104 = 1;
  DFA::set_initial(__return_storage_ptr__,1);
  SyntaxTreeNode::~SyntaxTreeNode(this_01);
  operator_delete(this_01);
  while (que.c.
         super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         que.c.
         super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&it,
               que.c.
               super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::pop_front(&que.c);
    lVar8 = 0;
    while( true ) {
      if ((int)((ulong)((long)piStack_f0 - (long)_it) >> 2) <= (int)lVar8) break;
      next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      lVar9 = (long)(int)lVar8;
      lVar8 = lVar9;
      while( true ) {
        if ((int)((ulong)((long)piStack_f0 - (long)_it) >> 2) <= lVar8) break;
        pcVar3 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        cVar1 = pcVar3[_it[lVar9]];
        if (cVar1 != pcVar3[_it[lVar8]]) goto LAB_00103732;
        p_Var7 = &(this->follow_pos_).
                  super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[_it[lVar8]]._M_h._M_before_begin;
        while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
          it_1 = (int)*(size_type *)(p_Var7 + 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &next.super__Vector_base<int,_std::allocator<int>_>,&it_1);
        }
        lVar8 = lVar8 + 1;
      }
      cVar1 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[_it[lVar9]];
LAB_00103732:
      if (cVar1 != '#') {
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
        std::vector<int,_std::allocator<int>_>::erase
                  ((vector<int,_std::allocator<int>_> *)
                   &next.super__Vector_base<int,_std::allocator<int>_>,
                   (const_iterator)__first._M_current,
                   (const_iterator)
                   next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::
        sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c)this);
        pmVar4 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](this_00,(key_type *)
                                      &next.super__Vector_base<int,_std::allocator<int>_>);
        if (*pmVar4 == 0) {
          pmVar4 = std::
                   map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ::operator[](this_00,(key_type *)
                                        &next.super__Vector_base<int,_std::allocator<int>_>);
          local_104 = local_104 + 1;
          *pmVar4 = local_104;
          DFA::add_node(__return_storage_ptr__,local_104);
          std::
          deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(&que.c,(value_type *)&next.super__Vector_base<int,_std::allocator<int>_>);
        }
        pmVar4 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](this_00,(key_type *)&it);
        iVar2 = *pmVar4;
        cVar1 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[_it[lVar9]];
        pmVar4 = std::
                 map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ::operator[](this_00,(key_type *)
                                      &next.super__Vector_base<int,_std::allocator<int>_>);
        DFA::add_transition(__return_storage_ptr__,iVar2,cVar1,*pmVar4);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&next.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&it);
  }
  p_Var6 = (this->mark_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->mark_)._M_t._M_impl.super__Rb_tree_header) {
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~deque(&que.c);
      std::__cxx11::string::~string((string *)&simplified_expr);
      return __return_storage_ptr__;
    }
    std::pair<const_std::vector<int,_std::allocator<int>_>,_int>::pair
              ((pair<const_std::vector<int,_std::allocator<int>_>,_int> *)&it,
               (pair<const_std::vector<int,_std::allocator<int>_>,_int> *)(p_Var6 + 1));
    piVar5 = _it;
    do {
      if (piVar5 == piStack_f0) goto LAB_00103869;
      iVar2 = *piVar5;
      piVar5 = piVar5 + 1;
    } while ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2] != '#');
    DFA::add_final(__return_storage_ptr__,local_e0);
LAB_00103869:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&it);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

DFA RegexToDFAConverter::convert(const string &expr) {
  string simplified_expr = simplify(expr);

  //evaluate expression
  int curr_pos = 0;
  leaves_count_ = 0, follow_pos_.clear(); what_letter_.clear();
  auto syntax_tree_root = expression_eval(simplified_expr, curr_pos);

  auto comp = [&](int a, int b) -> bool {
    return (what_letter_[a] == what_letter_[b] ? a < b : what_letter_[a] < what_letter_[b]);
  };

  //initialize queue with first_pos of all the syntax tree as a starting state
  queue< vector<int> > que;
  que.push(vector<int>());
  for (int it : syntax_tree_root->first_pos)
    que.front().push_back(it);
  sort(que.front().begin(), que.front().end(), comp);

  mark_.clear();
  int num_states = 0;
  DFA res;
  mark_[que.front()] = ++num_states;
  res.add_node(num_states);
  res.set_initial(num_states);
  delete syntax_tree_root;

  while (!que.empty()) {
    auto curr_state = que.front();
    que.pop();

    //for each state generate a next state based on follow_pos and by choosing
    //subsets of positions with same letter

    int i = 0;
    while (i < (int)curr_state.size()) {
      int j = i;
      vector< int > next;
      while (j < (int)curr_state.size() && what_letter_[curr_state[i]] == what_letter_[curr_state[j]]) {
        for (int it : follow_pos_[curr_state[j]])
          next.push_back(it);
        j++;
      }

      //ignore states generated by the end marker
      if (what_letter_[curr_state[i]] == '#') {
        i = j;
        continue;
      }
      sort(next.begin(), next.end());
      next.erase(unique(next.begin(), next.end()), next.end());
      sort(next.begin(), next.end(), comp);

      //add the new state
      if (!mark_[next]) {
        mark_[next] = ++num_states;
        res.add_node(num_states);
        que.push(next);
      }

      //and the corresponding transition
      res.add_transition(mark_[curr_state], what_letter_[curr_state[i]], mark_[next]);
      i = j;
    }
  }

  for (auto it : mark_)
    for (int state : it.first)
      if (what_letter_[state] == '#') {
        res.add_final(it.second);
        break;
      }

  return res;
}